

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_remove_handle(Curl_multi *multi,Curl_easy *data)

{
  CURLMstate CVar1;
  Curl_llist_element *e;
  curl_socket_t cVar2;
  CURLMcode CVar3;
  Curl_llist *pCVar4;
  connectdata *c;
  
  CVar3 = CURLM_BAD_HANDLE;
  if (multi != (Curl_multi *)0x0) {
    c = (connectdata *)0x1;
    if (((multi->magic == 0xbab1e) && (CVar3 = CURLM_BAD_EASY_HANDLE, data != (Curl_easy *)0x0)) &&
       (data->magic == 0xc0dedbad)) {
      if (data->multi == (Curl_multi *)0x0) {
        CVar3 = CURLM_OK;
      }
      else if (data->multi == multi) {
        if ((multi->field_0x1b1 & 4) == 0) {
          CVar1 = data->mstate;
          if (CVar1 < MSTATE_COMPLETED) {
            multi->num_alive = multi->num_alive - 1;
          }
          if ((data->conn != (connectdata *)0x0) &&
             ((5 < CVar1 - MSTATE_DOING ||
              (Curl_conncontrol(data->conn,2), data->conn != (connectdata *)0x0)))) {
            multi_done(data,data->result,CVar1 < MSTATE_COMPLETED);
          }
          Curl_expire_clear(data);
          if ((data->connect_queue).ptr != (void *)0x0) {
            Curl_llist_remove(&multi->pending + (data->mstate != MSTATE_PENDING),
                              &data->connect_queue,(void *)0x0);
          }
          if ((data->mstate != MSTATE_PENDING) && (data->mstate != MSTATE_MSGSENT)) {
            unlink_easy(multi,data);
          }
          if ((data->dns).hostcachetype == HCACHE_MULTI) {
            (data->dns).hostcache = (Curl_hash *)0x0;
            (data->dns).hostcachetype = HCACHE_NONE;
          }
          Curl_wildcard_dtor(&data->wildcard);
          data->mstate = MSTATE_COMPLETED;
          singlesocket(multi,data);
          Curl_detach_connection(data);
          if ((((data->set).connect_only != '\0') && (data->multi_easy == (Curl_multi *)0x0)) &&
             (cVar2 = Curl_getconnectinfo(data,&c), c != (connectdata *)0x0 && cVar2 != -1)) {
            Curl_conncache_remove_conn(data,c,true);
            Curl_disconnect(data,c,true);
          }
          if ((data->state).lastconnect_id != -1) {
            Curl_conncache_foreach(data,(data->state).conn_cache,(void *)0x0,close_connect_only);
          }
          (data->state).conn_cache = (conncache *)0x0;
          data->multi = (Curl_multi *)0x0;
          pCVar4 = &multi->msglist;
          while (e = pCVar4->head, e != (Curl_llist_element *)0x0) {
            if (*(Curl_easy **)((long)e->ptr + 0x20) == data) {
              Curl_llist_remove(&multi->msglist,e,(void *)0x0);
              break;
            }
            pCVar4 = (Curl_llist *)&e->next;
          }
          multi->num_easy = multi->num_easy - 1;
          process_pending_handles(multi);
          CVar3 = Curl_update_timer(multi);
        }
        else {
          CVar3 = CURLM_RECURSIVE_API_CALL;
        }
      }
    }
  }
  return CVar3;
}

Assistant:

CURLMcode curl_multi_remove_handle(struct Curl_multi *multi,
                                   struct Curl_easy *data)
{
  struct Curl_easy *easy = data;
  bool premature;
  struct Curl_llist_element *e;
  CURLMcode rc;

  /* First, make some basic checks that the CURLM handle is a good handle */
  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  /* Verify that we got a somewhat good easy handle too */
  if(!GOOD_EASY_HANDLE(data))
    return CURLM_BAD_EASY_HANDLE;

  /* Prevent users from trying to remove same easy handle more than once */
  if(!data->multi)
    return CURLM_OK; /* it is already removed so let's say it is fine! */

  /* Prevent users from trying to remove an easy handle from the wrong multi */
  if(data->multi != multi)
    return CURLM_BAD_EASY_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  premature = (data->mstate < MSTATE_COMPLETED) ? TRUE : FALSE;

  /* If the 'state' is not INIT or COMPLETED, we might need to do something
     nice to put the easy_handle in a good known state when this returns. */
  if(premature) {
    /* this handle is "alive" so we need to count down the total number of
       alive connections when this is removed */
    multi->num_alive--;
  }

  if(data->conn &&
     data->mstate > MSTATE_DO &&
     data->mstate < MSTATE_COMPLETED) {
    /* Set connection owner so that the DONE function closes it.  We can
       safely do this here since connection is killed. */
    streamclose(data->conn, "Removed with partial response");
  }

  if(data->conn) {
    /* multi_done() clears the association between the easy handle and the
       connection.

       Note that this ignores the return code simply because there's
       nothing really useful to do with it anyway! */
    (void)multi_done(data, data->result, premature);
  }

  /* The timer must be shut down before data->multi is set to NULL, else the
     timenode will remain in the splay tree after curl_easy_cleanup is
     called. Do it after multi_done() in case that sets another time! */
  Curl_expire_clear(data);

  if(data->connect_queue.ptr) {
    /* the handle is in the pending or msgsent lists, so go ahead and remove
       it */
    if(data->mstate == MSTATE_PENDING)
      Curl_llist_remove(&multi->pending, &data->connect_queue, NULL);
    else
      Curl_llist_remove(&multi->msgsent, &data->connect_queue, NULL);
  }
  if(in_main_list(data))
    unlink_easy(multi, data);

  if(data->dns.hostcachetype == HCACHE_MULTI) {
    /* stop using the multi handle's DNS cache, *after* the possible
       multi_done() call above */
    data->dns.hostcache = NULL;
    data->dns.hostcachetype = HCACHE_NONE;
  }

  Curl_wildcard_dtor(&data->wildcard);

  /* change state without using multistate(), only to make singlesocket() do
     what we want */
  data->mstate = MSTATE_COMPLETED;

  /* This ignores the return code even in case of problems because there's
     nothing more to do about that, here */
  (void)singlesocket(multi, easy); /* to let the application know what sockets
                                      that vanish with this handle */

  /* Remove the association between the connection and the handle */
  Curl_detach_connection(data);

  if(data->set.connect_only && !data->multi_easy) {
    /* This removes a handle that was part the multi interface that used
       CONNECT_ONLY, that connection is now left alive but since this handle
       has bits.close set nothing can use that transfer anymore and it is
       forbidden from reuse. And this easy handle cannot find the connection
       anymore once removed from the multi handle

       Better close the connection here, at once.
    */
    struct connectdata *c;
    curl_socket_t s;
    s = Curl_getconnectinfo(data, &c);
    if((s != CURL_SOCKET_BAD) && c) {
      Curl_conncache_remove_conn(data, c, TRUE);
      Curl_disconnect(data, c, TRUE);
    }
  }

  if(data->state.lastconnect_id != -1) {
    /* Mark any connect-only connection for closure */
    Curl_conncache_foreach(data, data->state.conn_cache,
                           NULL, close_connect_only);
  }

#ifdef USE_LIBPSL
  /* Remove the PSL association. */
  if(data->psl == &multi->psl)
    data->psl = NULL;
#endif

  /* as this was using a shared connection cache we clear the pointer to that
     since we're not part of that multi handle anymore */
  data->state.conn_cache = NULL;

  data->multi = NULL; /* clear the association to this multi handle */

  /* make sure there's no pending message in the queue sent from this easy
     handle */
  for(e = multi->msglist.head; e; e = e->next) {
    struct Curl_message *msg = e->ptr;

    if(msg->extmsg.easy_handle == easy) {
      Curl_llist_remove(&multi->msglist, e, NULL);
      /* there can only be one from this specific handle */
      break;
    }
  }

  /* NOTE NOTE NOTE
     We do not touch the easy handle here! */
  multi->num_easy--; /* one less to care about now */

  process_pending_handles(multi);

  rc = Curl_update_timer(multi);
  if(rc)
    return rc;
  return CURLM_OK;
}